

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

WalletDescriptor * __thiscall
wallet::DescriptorScriptPubKeyMan::GetWalletDescriptor
          (WalletDescriptor *__return_storage_ptr__,DescriptorScriptPubKeyMan *this)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    WalletDescriptor::WalletDescriptor(__return_storage_ptr__,&this->m_wallet_descriptor);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

WalletDescriptor DescriptorScriptPubKeyMan::GetWalletDescriptor() const
{
    return m_wallet_descriptor;
}